

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O3

bool_t priNextPrimeW(word *p,word a,void *stack)

{
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  
  *p = a;
  sVar2 = wwBitSize(p,1);
  if (1 < sVar2) {
    *(byte *)p = (byte)*p | 1;
    do {
      bVar1 = priIsPrimeW(*p,stack);
      if (bVar1 != 0) {
        return 1;
      }
      *p = *p + 2;
      sVar3 = wwBitSize(p,1);
    } while (sVar3 == sVar2);
  }
  return 0;
}

Assistant:

bool_t priNextPrimeW(word p[1], register word a, void* stack)
{
	register size_t l;
	// p <- a, l <- битовая длина a
	p[0] = a, l = wwBitSize(p, 1);
	// 0-битовых и 1-битовых простых не существует
	if (l <= 1)
		return FALSE;
	// сделать p нечетным
	p[0] |= 1;
	// поиск
	while (!priIsPrimeW(p[0], stack))
	{
		p[0] += 2;
		if (wwBitSize(p, 1) != l)
		{
			l = 0;
			return FALSE;
		}
	}
	l = 0;
	return TRUE;
}